

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O1

DeviceMemoryRangeVk * __thiscall
Diligent::DeviceMemoryVkImpl::GetRange
          (DeviceMemoryRangeVk *__return_storage_ptr__,DeviceMemoryVkImpl *this,Uint64 Offset,
          Uint64 Size)

{
  ulong uVar1;
  pointer pVVar2;
  ulong uVar3;
  ulong uVar4;
  string msg;
  string local_30;
  
  uVar1 = (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
          .m_Desc.PageSize;
  uVar3 = Offset % uVar1;
  __return_storage_ptr__->Handle = (VkDeviceMemory)0x0;
  __return_storage_ptr__->Offset = 0;
  __return_storage_ptr__->Size = 0;
  pVVar2 = (this->m_Pages).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (Offset / uVar1 <
      (ulong)(((long)(this->m_Pages).
                     super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) *
             -0x5555555555555555)) {
    if (uVar3 + Size <= uVar1) {
      __return_storage_ptr__->Offset = uVar3;
      __return_storage_ptr__->Handle = pVVar2[Offset / uVar1].m_VkObject;
      uVar4 = uVar1 - uVar3;
      if (Size <= uVar1 - uVar3) {
        uVar4 = Size;
      }
      __return_storage_ptr__->Size = uVar4;
      return __return_storage_ptr__;
    }
    FormatString<char[77]>
              (&local_30,
               (char (*) [77])
               "DeviceMemoryVkImpl::GetRange(): Offset and Size must be inside a single page");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0xc1);
  }
  else {
    FormatString<char[72]>
              (&local_30,
               (char (*) [72])
               "DeviceMemoryVkImpl::GetRange(): Offset is out of allocated space bounds");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0xba);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DeviceMemoryRangeVk DeviceMemoryVkImpl::GetRange(Uint64 Offset, Uint64 Size) const
{
    const auto PageIdx = static_cast<size_t>(Offset / m_Desc.PageSize);

    DeviceMemoryRangeVk Range{};
    if (PageIdx >= m_Pages.size())
    {
        DEV_ERROR("DeviceMemoryVkImpl::GetRange(): Offset is out of allocated space bounds");
        return Range;
    }

    const auto OffsetInPage = Offset % m_Desc.PageSize;
    if (OffsetInPage + Size > m_Desc.PageSize)
    {
        DEV_ERROR("DeviceMemoryVkImpl::GetRange(): Offset and Size must be inside a single page");
        return Range;
    }

    Range.Offset = OffsetInPage;
    Range.Handle = m_Pages[PageIdx];
    Range.Size   = std::min(m_Desc.PageSize - OffsetInPage, Size);

    return Range;
}